

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void WriteIndentChar(TidyDocImpl *doc)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (doc->pprint).indent[0].spaces;
  uVar3 = 0;
  if ((0 < (int)uVar2) &&
     (uVar1 = *(uint *)((doc->config).value + 0x53), uVar3 = (ulong)uVar2,
     uVar1 != 0 && doc->indent_char == 9)) {
    uVar3 = 1;
    if (uVar1 <= uVar2) {
      uVar3 = (ulong)uVar2 / (ulong)uVar1;
    }
  }
  uVar2 = (uint)uVar3;
  while (uVar2 != 0) {
    prvTidyWriteChar(doc->indent_char,doc->docOut);
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
  }
  return;
}

Assistant:

static void WriteIndentChar(TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;
    uint spaces = GetSpaces(pprint);
    uint tabsize = cfg(doc, TidyTabSize);
    if (spaces && (doc->indent_char == '\t') && tabsize)
    {
        spaces /= tabsize;  /* set number of tabs to output */
        if (spaces == 0)    /* with a minimum of one */
            spaces = 1;
    }
    for (i = 0; i < spaces; i++)
        TY_(WriteChar)(doc->indent_char, doc->docOut); /* 20150515 - Issue #108 */

}